

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O3

int ON_FindLocalMinimum(_func_int_void_ptr_double_double_ptr_double_ptr *f,void *farg,double ax,
                       double bx,double cx,double rel_stepsize_tol,double abs_stepsize_tol,
                       int max_it,double *t_addr)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  char *sFormat;
  undefined4 uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  ulong uVar6;
  double in_XMM0_Qb;
  double dVar7;
  double in_XMM1_Qb;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double fx;
  double dx;
  double fu;
  double du;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  if (t_addr == (double *)0x0) {
    sFormat = "t_addr is nullptr";
    iVar2 = 0x4d;
  }
  else {
    *t_addr = bx;
    if (max_it < 2) {
      sFormat = "max_it must be >= 2";
      iVar2 = 0x55;
    }
    else {
      local_e0 = rel_stepsize_tol;
      local_d8 = bx;
      dStack_d0 = in_XMM1_Qb;
      local_b8 = ax;
      dStack_b0 = in_XMM0_Qb;
      local_98 = cx;
      bVar1 = ON_IsValid(rel_stepsize_tol);
      if (((1.0 <= local_e0) || (local_e0 <= 0.0)) || (!bVar1)) {
        sFormat = "rel_stepsize_tol must be strictly between 0.0 and 1.0";
        iVar2 = 0x5a;
      }
      else {
        bVar1 = ON_IsValid(abs_stepsize_tol);
        if (0.0 < abs_stepsize_tol && bVar1) {
          iVar2 = (*f)(farg,local_d8,&local_f8,&local_f0);
          if (iVar2 != 0) {
            if (iVar2 < 0) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                         ,0x6a,"","ON_FindLocalMinimum() f() failed to evaluate.");
            }
            *t_addr = local_d8;
            return (uint)(0 < iVar2);
          }
          dVar24 = local_b8;
          if (local_b8 <= local_98) {
            dVar24 = local_98;
          }
          dVar18 = local_b8;
          if (local_98 <= local_b8) {
            dVar18 = local_98;
          }
          local_68 = 0.0;
          dStack_60 = 0.0;
          local_e8 = local_f8;
          local_c8 = 0.0;
          uVar5 = extraout_RDX;
          dVar19 = dStack_b0;
          dVar20 = local_d8;
          dVar21 = dStack_d0;
          dVar22 = local_f0;
          dVar23 = local_f0;
          dVar26 = local_d8;
          dVar27 = local_d8;
          dVar25 = dStack_b0;
          dVar13 = local_f8;
          while( true ) {
            dVar7 = (dVar24 + dVar18) * 0.5;
            dStack_70 = ABS(dVar21);
            dVar28 = ABS(dVar20) * local_e0 + abs_stepsize_tol;
            dVar8 = dVar28 + dVar28;
            dVar9 = dVar24 - dVar18;
            if (ABS(dVar20 - dVar7) <= dVar9 * -0.5 + dVar8) {
              *t_addr = dVar20;
              return 1;
            }
            dStack_c0 = dVar19;
            if (ABS(local_c8) <= dVar28) {
              local_c8 = (double)(~-(ulong)(local_f0 < 0.0) & (ulong)dVar18 |
                                 -(ulong)(local_f0 < 0.0) & (ulong)dVar24) - dVar20;
              local_68 = local_c8 * 0.5;
              dStack_60 = dVar19;
            }
            else {
              auVar14._0_8_ = (dVar26 - dVar20) * local_f0;
              auVar14._8_8_ = (dVar27 - dVar20) * local_f0;
              auVar15._8_8_ = local_f0 - dVar23;
              auVar15._0_8_ = local_f0 - dVar22;
              auVar15 = divpd(auVar14,auVar15);
              auVar16._0_8_ = auVar15._0_8_ & -(ulong)(dVar22 != local_f0);
              auVar16._8_8_ = auVar15._8_8_ & -(ulong)(dVar23 != local_f0);
              auVar11._0_8_ = ~-(ulong)(dVar22 != local_f0) & (ulong)(dVar9 + dVar9);
              auVar11._8_8_ = ~-(ulong)(dVar23 != local_f0) & (ulong)(dVar9 + dVar9);
              auVar11 = auVar11 | auVar16;
              dVar9 = auVar11._0_8_;
              dVar12 = auVar11._8_8_;
              auVar17._8_8_ =
                   -(ulong)(0.0 < ((dVar20 + dVar12) - dVar24) * (dVar18 - (dVar20 + dVar12)));
              auVar17._0_8_ =
                   -(ulong)(0.0 < ((dVar20 + dVar9) - dVar24) * (dVar18 - (dVar20 + dVar9)));
              uVar4 = movmskpd((int)uVar5,auVar17);
              bVar1 = (bool)((byte)uVar4 >> 1 & local_f0 * dVar12 <= 0.0);
              bVar3 = local_f0 * dVar9 <= 0.0 & (byte)uVar4;
              if ((bVar1 == false) && (bVar3 == 0)) {
                local_c8 = (double)(~-(ulong)(local_f0 < 0.0) & (ulong)dVar18 |
                                   -(ulong)(local_f0 < 0.0) & (ulong)dVar24) - dVar20;
                local_68 = local_c8 * 0.5;
                dStack_60 = dVar19;
              }
              else {
                if ((bVar3 & bVar1) == 1) {
                  bVar1 = ABS(dVar12) < ABS(dVar9);
                }
                uVar4 = auVar11._8_4_;
                uVar10 = auVar11._12_4_;
                if (bVar1 == false) {
                  uVar4 = auVar11._0_4_;
                  uVar10 = auVar11._4_4_;
                }
                if (ABS((double)CONCAT44(uVar10,uVar4)) <= ABS(local_c8 * 0.5)) {
                  dVar9 = dVar20 + (double)CONCAT44(uVar10,uVar4);
                  if ((dVar9 - dVar18 < dVar8) || (dVar24 - dVar9 < dVar8)) {
                    local_c8 = local_68;
                    dStack_c0 = dStack_60;
                    uVar6 = -(ulong)(dVar20 <= dVar7);
                    local_68 = (double)(~uVar6 & (ulong)-dVar28 | uVar6 & (ulong)dVar28);
                    dStack_60 = (double)(~(ulong)dVar21 & (ulong)-dStack_70 |
                                        (ulong)dVar21 & (ulong)dStack_70);
                  }
                  else {
                    local_c8 = local_68;
                    dStack_c0 = dStack_60;
                    local_68 = (double)CONCAT44(uVar10,uVar4);
                    dStack_60 = dVar12;
                  }
                }
                else {
                  local_c8 = (double)(~-(ulong)(local_f0 < 0.0) & (ulong)dVar18 |
                                     -(ulong)(local_f0 < 0.0) & (ulong)dVar24) - dVar20;
                  local_68 = local_c8 * 0.5;
                  dStack_60 = dVar19;
                }
              }
            }
            local_d8 = dVar20;
            dStack_d0 = dVar21;
            local_b8 = dVar18;
            dStack_b0 = dVar19;
            local_98 = dVar24;
            dStack_90 = dVar25;
            local_80 = dVar13;
            local_58 = dVar26;
            dStack_50 = dVar27;
            local_48 = dVar22;
            dStack_40 = dVar23;
            if (ABS(local_68) < dVar28) break;
            local_78 = dVar20 + local_68;
            dStack_70 = dVar21;
            iVar2 = (*f)(farg,local_78,&local_a8,&local_a0);
            uVar5 = extraout_RDX_01;
LAB_0056022c:
            dVar23 = local_f0;
            dVar13 = local_f8;
            if (iVar2 != 0) {
              if (-1 < iVar2) {
                *t_addr = (double)(~-(ulong)(local_a8 < local_f8) & (ulong)local_d8 |
                                  (ulong)local_78 & -(ulong)(local_a8 < local_f8));
                return 1;
              }
              goto LAB_00560586;
            }
            dVar22 = dStack_40;
            dVar26 = dStack_50;
            if (local_a8 <= local_f8) {
              if (local_d8 <= local_78) {
                local_b8 = local_d8;
                dStack_b0 = dStack_d0;
              }
              dVar24 = (double)(~-(ulong)(local_78 < local_d8) & (ulong)local_98 |
                               -(ulong)(local_78 < local_d8) & (ulong)local_d8);
              dVar25 = (double)(~(ulong)dStack_d0 & (ulong)dStack_90 | (ulong)dStack_d0);
              local_f8 = local_a8;
              local_f0 = local_a0;
              local_e8 = local_80;
              dVar20 = local_78;
              dVar21 = dStack_70;
              dVar27 = local_d8;
              dVar18 = local_b8;
              dVar19 = dStack_b0;
            }
            else {
              dVar18 = local_78;
              dVar19 = dStack_70;
              if (local_d8 <= local_78) {
                dVar18 = local_b8;
                dVar19 = dStack_b0;
              }
              dVar25 = (double)((ulong)dStack_90 & (ulong)dStack_70);
              dVar24 = (double)((ulong)local_98 & -(ulong)(local_78 < local_d8) |
                               ~-(ulong)(local_78 < local_d8) & (ulong)local_78);
              dVar20 = local_d8;
              dVar21 = dStack_d0;
              if (local_80 < local_a8) {
                if ((dStack_50 != local_d8) || (NAN(dStack_50) || NAN(local_d8))) {
                  dVar13 = local_80;
                  dVar23 = dStack_40;
                  dVar27 = dStack_50;
                  if (local_e8 <= local_a8) {
                    if (((local_58 != local_d8) || (NAN(local_58) || NAN(local_d8))) &&
                       ((dVar22 = local_48, dVar26 = local_58, local_58 != dStack_50 ||
                        (NAN(local_58) || NAN(dStack_50))))) goto LAB_00560492;
                  }
                  local_e8 = local_a8;
                  dVar22 = local_a0;
                  dVar26 = local_78;
                  goto LAB_00560492;
                }
              }
              local_e8 = local_80;
              dVar23 = local_a0;
              dVar27 = local_78;
              dVar13 = local_a8;
            }
LAB_00560492:
            max_it = max_it + -1;
            if (max_it == 0) {
              *t_addr = dVar20;
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                         ,0xc0,"","ON_FindLocalMinimum() failed to converge");
              return 2;
            }
          }
          local_78 = (double)(~-(ulong)(local_68 < 0.0) & (ulong)dVar28 |
                             (ulong)-dVar28 & -(ulong)(local_68 < 0.0)) + dVar20;
          iVar2 = (*f)(farg,local_78,&local_a8,&local_a0);
          if (-1 < iVar2) {
            uVar5 = extraout_RDX_00;
            if (local_f8 < local_a8) {
              *t_addr = local_d8;
              return 1;
            }
            goto LAB_0056022c;
          }
LAB_00560586:
          sFormat = "ON_FindLocalMinimum() f() failed to evaluate.";
          iVar2 = 0xa9;
        }
        else {
          sFormat = "abs_stepsize_tol must be > 0";
          iVar2 = 0x5f;
        }
      }
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
             ,iVar2,"",sFormat);
  return 0;
}

Assistant:

int ON_FindLocalMinimum(
                int (*f)(void*,double,double*,double*), void* farg,
                double ax, double bx, double cx,
                double rel_stepsize_tol, double abs_stepsize_tol, int max_it, 
                double *t_addr
                )
/* Use Brent's algorithm (with derivative) to Find a (local) minimum of a function
 *
 * INPUT:
 *   ax, bx, cx a bracketed minimum satisfying conditions 1 and 2.
 *      1) either ax < bx < cx or cx < bx < ax.
 *      2) f(bx) < f(ax) and f(bx) < f(ax).
 *   farg
 *      pointer passed to function f()
 *   f
 *      evaluation function with prototype
 *              int f(void* farg,double t,double* ft,double* dft)
 *      f(farg,t,&ft,&dft) should compute ft = value of function at t
 *      and dft = value of derivative at t.
 *      -1: failure
 *       0: success
 *       1: |f(x)| is small enough - TL_NRdbrent() will return *t_addr = x
 *          and the return code 1.
 *   rel_stepsize_tol, abs_stepsize_tol  (0 < rel_stepsize_tol < 1 and 0 < abs_stepsize_tol)
 *      rel_stepsize_tol is a fractional tolerance and abs_stepsize_tol is an absolute tolerance
 *      that determine the minimum step size for a given iteration.
 *        minimum delta t = rel_stepsize_tol*|t| + abs_stepsize_tol.
 *      When in doubt, use 
 *         rel_stepsize_tol = ON_EPSILON 
 *         abs_stepsize_tol = 1/2*(desired absolute precision for *t_addr).
 *   max_it ( >= 2)
 *      maximum number of iterations to permit (when in doubt use 100)
 *      Closest Point to bezier minimizations typically take < 30
 *      iterations.
 *
 * OUTPUT:
 *   *t_addr abcissa of a local minimum between ax and cx.
 *       0: failure
 *       1: success
 *       2: After max_iteration_cnt iterations the tolerance restrictions
 *          where not satisfied.  Try increasing max_it, rel_stepsize_tol and/or abs_stepsize_tol
 *          or use the value of (*t_addr) with extreme caution.
 */
{
  // See Numerical Recipes in C's dbrent() for a description of the basic algorithm
  int rc,ok1,ok2;
  double a,b,d,d1,d2,du,dv,dw,dx,e,fu,fv,fw,fx,olde,tol1,tol2,u,u1,u2,v,w,x,xm;

  d=e=0.0;

  if ( 0 == t_addr )
  {
    ON_ERROR("t_addr is nullptr");
    return 0;
  }

  *t_addr = bx;

  if ( max_it < 2 )
  {
    ON_ERROR("max_it must be >= 2");
    return 0;
  }
  if ( !ON_IsValid(rel_stepsize_tol) || rel_stepsize_tol <= 0.0 || rel_stepsize_tol >= 1.0 )
  {
    ON_ERROR("rel_stepsize_tol must be strictly between 0.0 and 1.0");
    return 0;
  }
  if ( !ON_IsValid(abs_stepsize_tol) || abs_stepsize_tol <= 0.0 )
  {
    ON_ERROR("abs_stepsize_tol must be > 0");
    return 0;
  }

  a=(ax < cx ? ax : cx);
  b=(ax > cx ? ax : cx);
  x=w=v=bx;
  rc = f(farg,x,&fx,&dx);
  if (rc) {
     // f() returned nonzero return code which means we need to bailout
    if ( rc < 0 ) {
      ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
    }
    *t_addr = x;
    return rc>0 ? 1 : 0; // return 1 means f() said result is good enough, return = 0 means f() failed
  }
  fw=fv=fx;
  dw=dv=dx;
  while(max_it--) {
    xm=0.5*(a+b);
    tol1=rel_stepsize_tol*fabs(x)+abs_stepsize_tol;
    tol2=2.0*tol1;
    if (fabs(x-xm) <= (tol2-0.5*(b-a))) {
      // further adjustments to x are smaller than stepsize tolerance
      *t_addr=x;
      return 1;
    }
    if (fabs(e) > tol1) {
      d1=2.0*(b-a);
      d2=d1;
      if (dw != dx) d1=(w-x)*dx/(dx-dw);
      if (dv != dx) d2=(v-x)*dx/(dx-dv);
      u1=x+d1;
      u2=x+d2;
      ok1 = (a-u1)*(u1-b) > 0.0 && dx*d1 <= 0.0;
      ok2 = (a-u2)*(u2-b) > 0.0 && dx*d2 <= 0.0;
      olde=e;
      e=d;
      if (ok1 || ok2) {
        if (ok1 && ok2)
          d=(fabs(d1) < fabs(d2) ? d1 : d2);
        else if (ok1)
          d=d1;
        else
          d=d2;
        if (fabs(d) <= fabs(0.5*olde)) {
          u=x+d;
          if (u-a < tol2 || b-u < tol2)
            {d = (xm >= x) ? tol1 : -tol1;}
        } else {
          d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
        }
      } else {
        d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
      }
    } else {
      d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
    }
    if (fabs(d) >= tol1) {
      u=x+d;
      rc = f(farg,u,&fu,&du);
    }
    else {
      u = (d >= 0.0) ? x+tol1 : x-tol1;
      rc = f(farg,u,&fu,&du);
      if (rc >= 0 && fu > fx) {
        // tweaking x any more increases function value - x is a numerical minimum
        *t_addr=x;
        return 1;
      }
    }
    if (rc) {
      // f() returned nonzero return code which means we need to bailout
      if ( rc < 0 ) {
        ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
      }
      else {
        *t_addr = (fu < fx) ? u : x;
      }
      return rc>0 ? 1 : 0;
    }
    if (fu <= fx) {
      if (u >= x) a=x; else b=x;
      v=w;fv=fw;dv=dw;
      w=x;fw=fx;dw=dx;
      x=u;fx=fu;dx=du;
    } else {
      if (u < x) a=u; else b=u;
      if (fu <= fw || w == x) {
        v=w;fv=fw;dv=dw;
        w=u;fw=fu;dw=du;
      } else if (fu < fv || v == x || v == w) {
        v=u;fv=fu;dv=du;
      }
    }
  }
  *t_addr = x; // best known answer
  ON_ERROR("ON_FindLocalMinimum() failed to converge");
  return 2; // 2 means we failed to converge
}